

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::RenderDeviceGLImpl::CreateRayTracingPipelineState
          (RenderDeviceGLImpl *this,RayTracingPipelineStateCreateInfo *PSOCreateInfo,
          IPipelineState **ppPipelineState)

{
  string msg;
  string local_30;
  
  FormatString<char[39]>(&local_30,(char (*) [39])"Ray tracing is not supported in OpenGL");
  DebugAssertionFailed
            (local_30._M_dataplus._M_p,"CreateRayTracingPipelineState",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
             ,0x23a);
  std::__cxx11::string::~string((string *)&local_30);
  *ppPipelineState = (IPipelineState *)0x0;
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateRayTracingPipelineState(const RayTracingPipelineStateCreateInfo& PSOCreateInfo, IPipelineState** ppPipelineState)
{
    UNSUPPORTED("Ray tracing is not supported in OpenGL");
    *ppPipelineState = nullptr;
}